

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::S2Builder(S2Builder *this,Options *options)

{
  pointer *__ptr;
  
  Options::Options(&this->options_);
  (this->min_edge_site_separation_ca_limit_).length2_ = 0.0;
  (this->max_adjacent_site_separation_ca_).length2_ = 0.0;
  (this->min_site_separation_ca_).length2_ = 0.0;
  (this->min_edge_site_separation_ca_).length2_ = 0.0;
  (this->min_edge_length_to_split_ca_).length2_ = 0.0;
  (this->min_site_separation_).radians_ = 0.0;
  (this->max_edge_deviation_).radians_ = 0.0;
  (this->edge_site_query_radius_ca_).length2_ = 0.0;
  (this->site_snap_radius_ca_).length2_ = 0.0;
  (this->edge_snap_radius_ca_).length2_ = 0.0;
  memset(&this->input_vertices_,0,0xa8);
  IdSetLexicon::IdSetLexicon(&this->label_set_lexicon_);
  (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edge_sites_).
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edge_sites_).
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edge_sites_).
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Init(this,options);
  return;
}

Assistant:

S2Builder::S2Builder(const Options& options) {
  Init(options);
}